

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O1

char * lj_buf_more2(SBuf *sb,MSize sz)

{
  ulong uVar1;
  bool bVar2;
  char *extraout_RAX;
  char *pcVar3;
  SBufExt *sbx;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  pcVar3 = (char *)(ulong)sz;
  uVar1 = (sb->L).ptr64;
  iVar4 = (int)sb->w;
  if ((uVar1 & 1) == 0) {
    if ((0x7fffff00 < sz) || (uVar5 = (iVar4 - *(int *)&sb->b) + sz, 0x7fffff00 < uVar5))
    goto LAB_001282c0;
    buf_grow(sb,uVar5);
    goto LAB_001282b8;
  }
  if (0x7fffff00 < sz) {
LAB_001282c0:
    lj_err_mem((lua_State *)(uVar1 & 0xfffffffffffffff8));
  }
  uVar8 = (long)sb->w - (long)sb[1].e;
  uVar5 = (int)uVar8 + sz;
  if (0x7fffff00 < uVar5) goto LAB_001282c0;
  iVar6 = (int)sb->b;
  uVar7 = *(int *)&sb->e - iVar6;
  if (uVar7 < uVar5) {
    buf_grow(sb,uVar5);
    pcVar3 = extraout_RAX;
LAB_0012828a:
    bVar2 = true;
    if (sb[1].e != sb->b) {
      uVar8 = uVar8 & 0xffffffff;
      memmove(sb->b,sb[1].e,uVar8);
      pcVar3 = sb->b;
      sb[1].e = pcVar3;
      pcVar3 = pcVar3 + uVar8;
      sb->w = pcVar3;
    }
  }
  else {
    if (uVar7 >> 3 <= (uint)((int)sb[1].e - iVar6)) goto LAB_0012828a;
    buf_grow(sb,(iVar4 - iVar6) + sz);
    pcVar3 = sb->w;
    bVar2 = false;
  }
  if (!bVar2) {
    return pcVar3;
  }
LAB_001282b8:
  return sb->w;
}

Assistant:

LJ_NOINLINE char *LJ_FASTCALL lj_buf_more2(SBuf *sb, MSize sz)
{
  if (sbufisext(sb)) {
    SBufExt *sbx = (SBufExt *)sb;
    MSize len = sbufxlen(sbx);
    if (LJ_UNLIKELY(sz > LJ_MAX_BUF || len + sz > LJ_MAX_BUF))
      lj_err_mem(sbufL(sbx));
    if (len + sz > sbufsz(sbx)) {  /* Must grow. */
      buf_grow((SBuf *)sbx, len + sz);
    } else if (sbufxslack(sbx) < (sbufsz(sbx) >> 3)) {
      /* Also grow to avoid excessive compactions, if slack < size/8. */
      buf_grow((SBuf *)sbx, sbuflen(sbx) + sz);  /* Not sbufxlen! */
      return sbx->w;
    }
    if (sbx->r != sbx->b) {  /* Compact by moving down. */
      memmove(sbx->b, sbx->r, len);
      sbx->r = sbx->b;
      sbx->w = sbx->b + len;
      lj_assertG_(G(sbufL(sbx)), len + sz <= sbufsz(sbx), "bad SBuf compact");
    }
  } else {
    MSize len = sbuflen(sb);
    lj_assertG_(G(sbufL(sb)), sz > sbufleft(sb), "SBuf overflow");
    if (LJ_UNLIKELY(sz > LJ_MAX_BUF || len + sz > LJ_MAX_BUF))
      lj_err_mem(sbufL(sb));
    buf_grow(sb, len + sz);
  }
  return sb->w;
}